

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typename.h
# Opt level: O3

string * type_name<int&>(void)

{
  char *pcVar1;
  char *__ptr;
  string *in_RDI;
  char *__s;
  
  pcVar1 = _put;
  __ptr = (char *)__cxa_demangle(_put + (*_put == '*'),0,0,0);
  __s = __ptr;
  if (__ptr == (char *)0x0) {
    __s = pcVar1 + (*pcVar1 == '*');
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>();
  std::__cxx11::string::append((char *)in_RDI);
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  return in_RDI;
}

Assistant:

std::string
type_name()
{
    typedef typename std::remove_reference<T>::type TR;
    std::unique_ptr<char, void(*)(void*)> own(
#ifndef _MSC_VER
        abi::__cxa_demangle(typeid(TR).name(), nullptr,
                            nullptr, nullptr),
#else
        nullptr,
#endif
        std::free);
    std::string r = own != nullptr ? own.get() : typeid(TR).name();
    if (std::is_const<TR>::value)
        r += " const";
    if (std::is_volatile<TR>::value)
        r += " volatile";
    if (std::is_lvalue_reference<T>::value)
        r += "&";
    else if (std::is_rvalue_reference<T>::value)
        r += "&&";
    return r;
}